

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O3

ResizeResult __thiscall
adios2::format::BPBase::ResizeBuffer(BPBase *this,size_t dataIn,string *hint)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ResizeResult RVar10;
  ulong uVar11;
  char cVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong currentSize;
  ulong __val;
  string __str;
  string local_200;
  string local_1e0;
  string local_1c0;
  string *local_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  string local_158;
  IOChrono *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_1a0 = hint;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"buffering","");
  local_138 = &this->m_Profiler;
  profiling::IOChrono::Start(&this->m_Profiler,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  currentSize = (long)(this->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  __val = (this->m_Parameters).MaxBufferSize;
  uVar11 = (this->m_Data).super_Buffer.m_Position + dataIn;
  if (dataIn <= __val) goto LAB_004acc4f;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Toolkit","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"format::bp::BPBase","");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"ResizeBuffer","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_70,vsnprintf,0x148,"%f",SUB84((double)dataIn * 9.5367431640625e-07,0));
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x749612);
  local_110 = &local_100;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar4[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_188 = *puVar8;
    lStack_180 = plVar4[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar8;
    local_198 = (ulong *)*plVar4;
  }
  local_190 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_130,vsnprintf,0x148,"%f",SUB84((double)__val * 9.5367431640625e-07,0));
  uVar13 = 0xf;
  if (local_198 != &local_188) {
    uVar13 = local_188;
  }
  if (uVar13 < local_130._M_string_length + local_190) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar14 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_130._M_string_length + local_190) goto LAB_004aca1c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_004aca1c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_130._M_dataplus._M_p);
  }
  local_178 = &local_168;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_168 = *puVar1;
    uStack_160 = puVar5[3];
  }
  else {
    local_168 = *puVar1;
    local_178 = (undefined8 *)*puVar5;
  }
  local_170 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(local_1a0->_M_dataplus)._M_p);
  psVar9 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158.field_2._8_8_ = plVar4[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar9;
    local_158._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_158._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  helper::Throw<std::runtime_error>(&local_1c0,&local_200,&local_1e0,&local_158,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
LAB_004acc4f:
  RVar10 = Unchanged;
  if (currentSize < uVar11) {
    if (__val < uVar11) {
      RVar10 = Flush;
      if (currentSize < __val) {
        cVar12 = '\x01';
        if (9 < __val) {
          uVar11 = __val;
          cVar3 = '\x04';
          do {
            cVar12 = cVar3;
            if (uVar11 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_004acefe;
            }
            if (uVar11 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_004acefe;
            }
            if (uVar11 < 10000) goto LAB_004acefe;
            bVar2 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar3 = cVar12 + '\x04';
          } while (bVar2);
          cVar12 = cVar12 + '\x01';
        }
LAB_004acefe:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_158,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_158._M_dataplus._M_p,(uint)local_158._M_string_length,__val);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x74968a);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
          local_1e0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar9;
          local_1e0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1e0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        psVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_200.field_2._M_allocated_capacity = *psVar9;
          local_200.field_2._8_8_ = puVar5[3];
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar9;
          local_200._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_200._M_string_length = puVar5[1];
        *puVar5 = psVar9;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_200,(ulong)(local_1a0->_M_dataplus)._M_p);
        psVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1c0.field_2._M_allocated_capacity = *psVar9;
          local_1c0.field_2._8_8_ = puVar5[3];
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        }
        else {
          local_1c0.field_2._M_allocated_capacity = *psVar9;
          local_1c0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_1c0._M_string_length = puVar5[1];
        *puVar5 = psVar9;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d0.field_2._M_allocated_capacity = *psVar9;
          local_d0.field_2._8_8_ = plVar4[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar9;
          local_d0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_d0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        BufferSTL::Resize(&this->m_Data,__val,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
    }
    else {
      sVar6 = helper::NextExponentialSize(uVar11,currentSize,(this->m_Parameters).GrowthFactor);
      if (sVar6 < __val) {
        __val = sVar6;
      }
      cVar12 = '\x01';
      if (9 < __val) {
        uVar11 = __val;
        cVar3 = '\x04';
        do {
          cVar12 = cVar3;
          if (uVar11 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_004acd51;
          }
          if (uVar11 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_004acd51;
          }
          if (uVar11 < 10000) goto LAB_004acd51;
          bVar2 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar3 = cVar12 + '\x04';
        } while (bVar2);
        cVar12 = cVar12 + '\x01';
      }
LAB_004acd51:
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_1e0,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_1e0._M_dataplus._M_p,(uint)local_1e0._M_string_length,__val);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,0x74968a);
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_200.field_2._M_allocated_capacity = *psVar9;
        local_200.field_2._8_8_ = plVar4[3];
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      else {
        local_200.field_2._M_allocated_capacity = *psVar9;
        local_200._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_200._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_1c0.field_2._M_allocated_capacity = *psVar9;
        local_1c0.field_2._8_8_ = plVar4[3];
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *psVar9;
        local_1c0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1c0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c0,(ulong)(local_1a0->_M_dataplus)._M_p);
      psVar9 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0.field_2._8_8_ = plVar4[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar9;
        local_f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_f0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      BufferSTL::Resize(&this->m_Data,__val,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      RVar10 = Success;
    }
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"buffering","");
  profiling::IOChrono::Stop(local_138,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return RVar10;
}

Assistant:

BPBase::ResizeResult BPBase::ResizeBuffer(const size_t dataIn, const std::string hint)
{
    m_Profiler.Start("buffering");
    const size_t currentSize = m_Data.m_Buffer.size();
    const size_t requiredSize = dataIn + m_Data.m_Position;
    const size_t maxBufferSize = m_Parameters.MaxBufferSize;

    ResizeResult result = ResizeResult::Unchanged;

    if (dataIn > maxBufferSize)
    {
        helper::Throw<std::runtime_error>(
            "Toolkit", "format::bp::BPBase", "ResizeBuffer",
            "data size: " + std::to_string(static_cast<float>(dataIn) / (1024. * 1024.)) +
                " Mb is too large for adios2 bp MaxBufferSize=" +
                std::to_string(static_cast<float>(maxBufferSize) / (1024. * 1024.)) +
                "Mb, try increasing MaxBufferSize in call to IO "
                "SetParameters " +
                hint);
    }

    if (requiredSize <= currentSize)
    {
        // do nothing, unchanged is default
    }
    else if (requiredSize > maxBufferSize)
    {
        if (currentSize < maxBufferSize)
        {
            m_Data.Resize(maxBufferSize, " when resizing buffer to " +
                                             std::to_string(maxBufferSize) + "bytes, " + hint +
                                             "\n");
        }
        result = ResizeResult::Flush;
    }
    else // buffer must grow
    {
        if (currentSize < maxBufferSize)
        {
            const float growthFactor = m_Parameters.GrowthFactor;
            const size_t nextSize =
                std::min(maxBufferSize,
                         helper::NextExponentialSize(requiredSize, currentSize, growthFactor));
            m_Data.Resize(nextSize, " when resizing buffer to " + std::to_string(nextSize) +
                                        "bytes, " + hint);
            result = ResizeResult::Success;
        }
    }

    m_Profiler.Stop("buffering");
    return result;
}